

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-trait.c
# Opt level: O1

void borg_notice(_Bool notice_swap)

{
  int *piVar1;
  int *piVar2;
  borg_item *item;
  uint8_t uVar3;
  byte bVar4;
  _Bool _Var5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  player_race *ppVar16;
  short *psVar17;
  object *poVar18;
  bool bVar19;
  borg_item_conflict *pbVar20;
  player *p;
  borg_item_conflict *pbVar21;
  _Bool _Var22;
  int16_t iVar23;
  ushort uVar24;
  wchar_t wVar25;
  uint uVar26;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  int iVar32;
  wchar_t wVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  int iVar37;
  int iVar38;
  undefined7 in_register_00000039;
  long lVar39;
  bitflag *flags;
  bitflag f [5];
  bitflag local_7c [5];
  byte local_77;
  byte local_76;
  byte local_75;
  byte local_74;
  byte local_73;
  byte local_72;
  byte local_71;
  int local_70;
  int local_6c;
  bitflag *local_68;
  undefined4 local_60;
  uint local_5c;
  int local_58;
  int local_54;
  undefined8 local_50;
  int16_t local_48;
  player_class *local_40;
  ulong local_38;
  uint uVar27;
  uint uVar28;
  
  local_60 = (undefined4)CONCAT71(in_register_00000039,notice_swap);
  memset(borg.has,0,(ulong)z_info->k_max << 2);
  memset(borg.trait,0,0x424);
  memset(borg.activation,0,(ulong)z_info->act_max << 2);
  piVar1 = borg.trait;
  borg.trait[0x92] = 1;
  piVar1[0x2c] = 0x6e;
  piVar1[0x98] = -1;
  piVar1[0x99] = 4;
  borg_notice_player();
  if (borg_do_spell == true) {
    borg_cheat_spells();
    borg_do_spell = false;
  }
  piVar1 = borg.trait;
  p = player;
  ppVar16 = player->race;
  local_40 = player->class;
  borg.trait[0x34] = ppVar16->infra;
  piVar1[0x36] = local_40->c_skills[0] + ppVar16->r_skills[0];
  piVar1[0x37] = local_40->c_skills[1] + ppVar16->r_skills[1];
  piVar1[0x38] = local_40->c_skills[2] + ppVar16->r_skills[2];
  piVar1[0x39] = local_40->c_skills[3] + ppVar16->r_skills[3];
  piVar1[0x3a] = local_40->c_skills[5] + ppVar16->r_skills[5];
  piVar1[0x3b] = local_40->c_skills[4] + ppVar16->r_skills[4];
  piVar1[0x3c] = local_40->c_skills[6] + ppVar16->r_skills[6];
  piVar1[0x3d] = local_40->c_skills[7] + ppVar16->r_skills[7];
  piVar1[0x3e] = local_40->c_skills[8] + ppVar16->r_skills[8];
  piVar1[0x3f] = local_40->c_skills[9] + ppVar16->r_skills[9];
  player_flags(p,local_7c);
  _Var22 = flag_has_dbg(local_7c,5,10,"f","OF_SLOW_DIGEST");
  if (_Var22) {
    borg.trait[0x30] = 1;
  }
  _Var22 = flag_has_dbg(local_7c,5,0xb,"f","OF_FEATHER");
  if (_Var22) {
    borg.trait[0x31] = 1;
  }
  _Var22 = flag_has_dbg(local_7c,5,0xc,"f","OF_REGEN");
  if (_Var22) {
    borg.trait[0x32] = 1;
  }
  _Var22 = flag_has_dbg(local_7c,5,0xd,"f","OF_TELEPATHY");
  if (_Var22) {
    borg.trait[0x25] = 1;
  }
  _Var22 = flag_has_dbg(local_7c,5,0xe,"f","OF_SEE_INVIS");
  if (_Var22) {
    borg.trait[0x33] = 1;
  }
  _Var22 = flag_has_dbg(local_7c,5,0xf,"f","OF_FREE_ACT");
  if (_Var22) {
    borg.trait[0x56] = 1;
  }
  _Var22 = flag_has_dbg(local_7c,5,0x10,"f","OF_HOLD_LIFE");
  if (_Var22) {
    borg.trait[0x55] = 1;
  }
  _Var22 = flag_has_dbg(local_7c,5,0x11,"f","OF_IMPACT");
  if (_Var22) {
    borg.trait[0xcc] = 1;
  }
  _Var22 = flag_has_dbg(local_7c,5,0x1a,"f","OF_AGGRAVATE");
  if (_Var22) {
    borg.trait[0xae] = 1;
  }
  _Var22 = flag_has_dbg(local_7c,5,0x18,"f","OF_AFRAID");
  if (_Var22) {
    borg.trait[0xba] = 1;
  }
  _Var22 = flag_has_dbg(local_7c,5,0x1b,"f","OF_DRAIN_EXP");
  if (_Var22) {
    borg.trait[0xbb] = 1;
  }
  sVar6 = ppVar16->el_info[2].res_level;
  if (sVar6 == -1) {
    borg.trait[0xbc] = 1;
  }
  sVar7 = ppVar16->el_info[0].res_level;
  if (sVar7 == -1) {
    borg.trait[0xbf] = 1;
  }
  sVar8 = ppVar16->el_info[3].res_level;
  if (sVar8 == -1) {
    borg.trait[0xbe] = 1;
  }
  sVar9 = ppVar16->el_info[1].res_level;
  if (sVar9 == -1) {
    borg.trait[0xbd] = 1;
  }
  if (sVar6 == 3) {
    borg.trait[0x40] = 1;
  }
  if (sVar7 == 3) {
    borg.trait[0x41] = 1;
  }
  if (sVar8 == 3) {
    borg.trait[0x42] = 1;
  }
  if (sVar9 == 3) {
    borg.trait[0x43] = 1;
  }
  if (0 < sVar6) {
    borg.trait[0x48] = 1;
  }
  if (0 < sVar9) {
    borg.trait[0x47] = 1;
  }
  if (0 < sVar6) {
    borg.trait[0x45] = 1;
  }
  if (0 < sVar8) {
    borg.trait[0x46] = 1;
  }
  if (0 < ppVar16->el_info[4].res_level) {
    borg.trait[0x49] = 1;
  }
  if (0 < ppVar16->el_info[5].res_level) {
    borg.trait[0x4b] = 1;
  }
  if (0 < ppVar16->el_info[6].res_level) {
    borg.trait[0x4c] = 1;
  }
  if (0 < ppVar16->el_info[7].res_level) {
    borg.trait[0x4f] = 1;
  }
  if (0 < ppVar16->el_info[8].res_level) {
    borg.trait[0x50] = 1;
  }
  if (0 < ppVar16->el_info[9].res_level) {
    borg.trait[0x51] = 1;
  }
  if (0 < ppVar16->el_info[10].res_level) {
    borg.trait[0x52] = 1;
  }
  if (0 < ppVar16->el_info[0xb].res_level) {
    borg.trait[0x53] = 1;
  }
  if (0 < ppVar16->el_info[0xc].res_level) {
    borg.trait[0x54] = 1;
  }
  _Var22 = flag_has_dbg(local_7c,0xb,6,"f","OF_PROT_FEAR");
  if (_Var22) {
    borg.trait[0x4a] = 1;
  }
  _Var22 = flag_has_dbg(local_7c,0xb,7,"f","OF_PROT_BLIND");
  if (_Var22) {
    borg.trait[0x4d] = 1;
  }
  _Var22 = flag_has_dbg(local_7c,0xb,8,"f","OF_PROT_CONF");
  if (_Var22) {
    borg.trait[0x4e] = 1;
  }
  _Var22 = flag_has_dbg(local_7c,0xb,1,"f","OF_SUST_STR");
  if (_Var22) {
    borg.trait[0x14] = 1;
  }
  _Var22 = flag_has_dbg(local_7c,0xb,2,"f","OF_SUST_INT");
  if (_Var22) {
    borg.trait[0x15] = 1;
  }
  _Var22 = flag_has_dbg(local_7c,0xb,3,"f","OF_SUST_WIS");
  if (_Var22) {
    borg.trait[0x16] = 1;
  }
  _Var22 = flag_has_dbg(local_7c,0xb,4,"f","OF_SUST_DEX");
  if (_Var22) {
    borg.trait[0x17] = 1;
  }
  _Var22 = flag_has_dbg(local_7c,0xb,5,"f","OF_SUST_CON");
  if (_Var22) {
    borg.trait[0x18] = 1;
  }
  psVar17 = player->timed;
  iVar32 = 10;
  if (((*psVar17 != 0) || (psVar17[0x1d] != 0)) || (iVar32 = 5, psVar17[0x1c] != 0)) {
    borg.trait[0x2c] = borg.trait[0x2c] + iVar32;
  }
  piVar1 = borg.activation;
  pbVar21 = borg_items;
  uVar36 = (ulong)z_info->pack_size;
  lVar39 = uVar36 * 0x388;
  lVar35 = 0x6c;
  do {
    if ((long)*(int *)(pbVar21[uVar36].desc + lVar35) != 0) {
      piVar2 = piVar1 + *(int *)(pbVar21[uVar36].desc + lVar35);
      *piVar2 = *piVar2 + 1;
    }
    lVar35 = lVar35 + 0x388;
  } while (lVar35 != 0x2acc);
  if (piVar1[act_staff_magi] != 0) {
    borg.trait[0xdb] = borg.trait[0xdb] + 10;
  }
  local_6c = 0;
  local_70 = 0;
  do {
    piVar1 = borg.trait;
    pbVar21 = borg_items;
    if (borg_items->curses[lVar39 + -0x26] != false) {
      _Var22 = borg_items->curses[lVar39 + -1];
      if ((_Var22 == true) && (borg.trait[0xa0] = borg.trait[0xa0] | 2, piVar1[0x9f] == 0)) {
        piVar1[0x9f] = (int)uVar36 + 1;
      }
      if (((pbVar21 == (borg_item_conflict *)0x0) ||
          (pbVar21->curses[lVar39 + -0x22] != false || _Var22 != false)) ||
         (pbVar21->curses[lVar39 + -2] == false)) {
        iVar23 = borg_item_weight((borg_item_conflict *)(pbVar21->desc + lVar39));
        borg.trait[0x104] = borg.trait[0x104] + (int)iVar23;
        _Var22 = borg_item_note_needs_id((borg_item_conflict *)(pbVar21->desc + lVar39));
        piVar1 = borg.trait;
        if (_Var22) {
          borg.trait[0xfe] = borg.trait[0xfe] + 1;
          piVar1[0xfd] = piVar1[0xfd] + 1;
        }
        piVar1 = borg.trait;
        poVar18 = player->obj_k;
        borg.trait[5] =
             borg.trait[5] +
             (int)poVar18->modifiers[0] * (int)*(short *)((long)pbVar21->modifiers + lVar39);
        piVar1[6] = piVar1[6] +
                    (int)poVar18->modifiers[1] *
                    (int)*(short *)((long)pbVar21->modifiers + lVar39 + 2);
        piVar1[7] = piVar1[7] +
                    (int)poVar18->modifiers[2] *
                    (int)*(short *)((long)pbVar21->modifiers + lVar39 + 4);
        piVar1[8] = piVar1[8] +
                    (int)poVar18->modifiers[3] *
                    (int)*(short *)((long)pbVar21->modifiers + lVar39 + 6);
        piVar1[9] = piVar1[9] +
                    (int)poVar18->modifiers[4] *
                    (int)*(short *)((long)pbVar21->modifiers + lVar39 + 8);
        piVar1[0xc1] = *(int *)((long)pbVar21->slays + lVar39 + 0xf0);
        piVar1[0xc2] = *(int *)((long)pbVar21->slays + lVar39 + 0xf4);
        piVar1[0xc3] = *(int *)((long)pbVar21->slays + lVar39 + 0xf8);
        piVar1[0xc4] = *(int *)((long)pbVar21->slays + lVar39 + 0xec);
        piVar1[0xc5] = *(int *)((long)pbVar21->slays + lVar39 + 0xdc);
        piVar1[0xc6] = *(int *)((long)pbVar21->slays + lVar39 + 0xe0);
        piVar1[199] = *(int *)((long)pbVar21->slays + lVar39 + 0xe4);
        piVar1[200] = *(int *)((long)pbVar21->slays + lVar39 + 0xe8);
        if (pbVar21->brands[lVar39] == true) {
          piVar1[0xcd] = 1;
        }
        if (pbVar21->brands[lVar39 + 1] == true) {
          piVar1[0xce] = 1;
        }
        if (pbVar21->brands[lVar39 + 2] == true) {
          piVar1[0xcf] = 1;
        }
        if (pbVar21->brands[lVar39 + 3] == true) {
          piVar1[0xd0] = 1;
        }
        if (pbVar21->brands[lVar39 + 4] == true) {
          piVar1[0xd1] = 1;
        }
        flags = pbVar21->flags + lVar39;
        _Var22 = flag_has_dbg(flags,5,0x11,"item->flags","OF_IMPACT");
        if (_Var22) {
          borg.trait[0xcc] = 1;
        }
        piVar2 = borg.trait;
        borg.trait[0x34] =
             borg.trait[0x34] + (int)*(short *)((long)pbVar21->modifiers + lVar39 + 0xe);
        piVar1 = piVar2 + 0x3a;
        *piVar1 = *piVar1 + (int)*(short *)((long)pbVar21->modifiers + lVar39 + 10);
        piVar2 = piVar2 + 0x3b;
        *piVar2 = *piVar2 + *(short *)((long)pbVar21->modifiers + lVar39 + 0xc) * 5;
        iVar32 = 0;
        if (pbVar21->curses[lVar39 + -0x2a] == true) {
          _Var22 = flag_has_dbg(flags,5,0x20,"item->flags","OF_DIG_1");
          iVar32 = 1;
          if (!_Var22) {
            _Var22 = flag_has_dbg(flags,5,0x21,"item->flags","OF_DIG_2");
            iVar32 = 2;
            if (!_Var22) {
              _Var22 = flag_has_dbg(flags,5,0x22,"item->flags","OF_DIG_3");
              iVar32 = (uint)_Var22 + (uint)_Var22 * 2;
            }
          }
        }
        piVar1 = borg.trait;
        borg.trait[0x3f] =
             borg.trait[0x3f] +
             (*(short *)((long)pbVar21->modifiers + lVar39 + 0x10) + iVar32) * 0x14;
        piVar1[0x2c] = piVar1[0x2c] + (int)*(short *)((long)pbVar21->modifiers + lVar39 + 0x12);
        if (uVar36 != z_info->pack_size) {
          piVar1[0x93] = piVar1[0x93] + (int)*(short *)((long)pbVar21->modifiers + lVar39 + 0x14);
        }
        local_58 = (int)*(short *)((long)pbVar21->modifiers + lVar39 + 0x16);
        local_54 = (int)*(short *)((long)pbVar21->modifiers + lVar39 + 0x18);
        piVar1[0x1a] = piVar1[0x1a] + (int)*(short *)((long)pbVar21->modifiers + lVar39 + 0x1a);
        _Var22 = flag_has_dbg(flags,5,0x1e,"item->flags","OF_LIGHT_2");
        iVar32 = 2;
        if (_Var22) {
LAB_0024eb12:
          borg.trait[0x1a] = borg.trait[0x1a] + iVar32;
        }
        else {
          _Var22 = flag_has_dbg(flags,5,0x1f,"item->flags","OF_LIGHT_3");
          iVar32 = 3;
          if (_Var22) goto LAB_0024eb12;
        }
        if ((0 < *(short *)((long)pbVar21->modifiers + lVar39 + 0x1a)) && (borg.trait[0x19] == 4)) {
          borg.trait[0x1a] = borg.trait[0x1a] + -1;
        }
        if ((uVar36 == (ulong)z_info->pack_size + 5) &&
           ((*(short *)(pbVar21->curses + lVar39 + -0x18) != 0 ||
            (_Var22 = flag_has_dbg(flags,5,0x15,"item->flags","OF_NO_FUEL"), _Var22)))) {
          borg.trait[0x1a] =
               borg.trait[0x1a] + (int)*(short *)((long)pbVar21->modifiers + lVar39 + 0x1a);
        }
        piVar1 = borg.trait;
        borg.trait[0x2e] =
             borg.trait[0x2e] + (int)*(short *)((long)pbVar21->modifiers + lVar39 + 0x1e);
        piVar1[0x2f] = piVar1[0x2f] + (int)*(short *)((long)pbVar21->modifiers + lVar39 + 0x1c);
        _Var22 = flag_has_dbg(flags,5,10,"item->flags","OF_SLOW_DIGEST");
        if (_Var22) {
          borg.trait[0x30] = 1;
        }
        _Var22 = flag_has_dbg(flags,5,0x1a,"item->flags","OF_AGGRAVATE");
        if (_Var22) {
          borg.trait[0xae] = 1;
        }
        _Var22 = flag_has_dbg(flags,5,0x16,"item->flags","OF_IMPAIR_HP");
        if (_Var22) {
          borg.trait[0xb6] = 1;
        }
        _Var22 = flag_has_dbg(flags,5,0x17,"item->flags","OF_IMPAIR_MANA");
        if (_Var22) {
          borg.trait[0xb7] = 1;
        }
        _Var22 = flag_has_dbg(flags,5,0x18,"item->flags","OF_AFRAID");
        if (_Var22) {
          borg.trait[0xba] = 1;
        }
        _Var22 = flag_has_dbg(flags,5,0x1b,"item->flags","OF_DRAIN_EXP");
        if (_Var22) {
          borg.trait[0xbb] = 1;
        }
        if (pbVar21->curses[lVar39 + 1] == true) {
          borg.trait[0xaf] = 1;
        }
        if (pbVar21->curses[lVar39 + 2] == true) {
          borg.trait[0xa3] = 1;
        }
        if (pbVar21->curses[lVar39 + 3] == true) {
          borg.trait[0xb0] = 1;
        }
        if (pbVar21->curses[lVar39 + 4] == true) {
          borg.trait[0xb1] = 1;
        }
        if (pbVar21->curses[lVar39 + 5] == true) {
          borg.trait[0xa1] = 1;
        }
        piVar1 = borg.trait;
        if (pbVar21->curses[lVar39 + 6] == true) {
          borg.trait[0xae] = 1;
          piVar1[0xa2] = 1;
        }
        if (pbVar21->curses[lVar39 + 7] == true) {
          borg.trait[0xb2] = 1;
        }
        if (pbVar21->curses[lVar39 + 8] == true) {
          borg.trait[0xb3] = 1;
        }
        if (pbVar21->curses[lVar39 + 9] == true) {
          borg.trait[0xb4] = 1;
        }
        if (pbVar21->curses[lVar39 + 10] == true) {
          borg.trait[0xb5] = 1;
        }
        if (pbVar21->curses[lVar39 + 0xb] == true) {
          borg.trait[0xa4] = 1;
        }
        if (pbVar21->curses[lVar39 + 0xc] == true) {
          borg.trait[0xa5] = 1;
        }
        if (pbVar21->curses[lVar39 + 0xd] == true) {
          borg.trait[0xa6] = 1;
        }
        if (pbVar21->curses[lVar39 + 0xe] == true) {
          borg.trait[0xa7] = 1;
        }
        if (pbVar21->curses[lVar39 + 0x10] == true) {
          borg.trait[0xa8] = 1;
        }
        if (pbVar21->curses[lVar39 + 0xf] == true) {
          borg.trait[0xa9] = 1;
        }
        if (pbVar21->curses[lVar39 + 0x11] == true) {
          borg.trait[0xaa] = 1;
        }
        if (pbVar21->curses[lVar39 + 0x12] == true) {
          borg.trait[0xb7] = 1;
        }
        if (pbVar21->curses[lVar39 + 0x13] == true) {
          borg.trait[0xb6] = 1;
        }
        if (pbVar21->curses[lVar39 + 0x14] == true) {
          borg.trait[0xba] = 1;
        }
        if (pbVar21->curses[lVar39 + 0x15] == true) {
          borg.trait[0xab] = 1;
        }
        if (pbVar21->curses[lVar39 + 0x16] == true) {
          borg.trait[0xac] = 1;
        }
        if (pbVar21->curses[lVar39 + 0x17] == true) {
          borg.trait[0xad] = 1;
        }
        piVar1 = borg.trait;
        if (pbVar21->curses[lVar39 + 0x18] == true) {
          borg.trait[0xbc] = 1;
          piVar1[0x46] = 1;
        }
        piVar1 = borg.trait;
        if (pbVar21->curses[lVar39 + 0x19] == true) {
          borg.trait[0xbe] = 1;
          piVar1[0x45] = 1;
        }
        if (pbVar21->curses[lVar39 + 0x1a] == true) {
          borg.trait[0xb8] = 1;
        }
        if (pbVar21->curses[lVar39 + 0x1b] == true) {
          borg.trait[0xb9] = 1;
        }
        if (pbVar21->curses[lVar39] == true) {
          borg.trait[0xc0] = 1;
        }
        if (*(short *)((long)&pbVar21->el_info[2].res_level + lVar39) == -1) {
          borg.trait[0xbc] = 1;
        }
        if (*(short *)((long)&pbVar21->el_info[0].res_level + lVar39) == -1) {
          borg.trait[0xbf] = 1;
        }
        if (*(short *)((long)&pbVar21->el_info[3].res_level + lVar39) == -1) {
          borg.trait[0xbe] = 1;
        }
        if (*(short *)((long)&pbVar21->el_info[1].res_level + lVar39) == -1) {
          borg.trait[0xbd] = 1;
        }
        _Var22 = flag_has_dbg(flags,5,0xc,"item->flags","OF_REGEN");
        if (_Var22) {
          borg.trait[0x32] = 1;
        }
        _Var22 = flag_has_dbg(flags,5,0xd,"item->flags","OF_TELEPATHY");
        if (_Var22) {
          borg.trait[0x25] = 1;
        }
        _Var22 = flag_has_dbg(flags,5,0xe,"item->flags","OF_SEE_INVIS");
        if (_Var22) {
          borg.trait[0x33] = 1;
        }
        _Var22 = flag_has_dbg(flags,5,0xb,"item->flags","OF_FEATHER");
        if (_Var22) {
          borg.trait[0x31] = 1;
        }
        _Var22 = flag_has_dbg(flags,5,0xf,"item->flags","OF_FREE_ACT");
        if (_Var22) {
          borg.trait[0x56] = 1;
        }
        _Var22 = flag_has_dbg(flags,5,0x10,"item->flags","OF_HOLD_LIFE");
        if (_Var22) {
          borg.trait[0x55] = 1;
        }
        _Var22 = flag_has_dbg(flags,5,8,"item->flags","OF_PROT_CONF");
        if (_Var22) {
          borg.trait[0x4e] = 1;
        }
        _Var22 = flag_has_dbg(flags,5,7,"item->flags","OF_PROT_BLIND");
        if (_Var22) {
          borg.trait[0x4d] = 1;
        }
        piVar1 = borg.trait;
        sVar6 = *(short *)((long)&pbVar21->el_info[2].res_level + lVar39);
        if (sVar6 == 3) {
          borg.trait[0x40] = 1;
          piVar1[0x45] = 1;
          borg.temp.res_fire = true;
        }
        piVar1 = borg.trait;
        sVar7 = *(short *)((long)&pbVar21->el_info[0].res_level + lVar39);
        if (sVar7 == 3) {
          borg.trait[0x41] = 1;
          piVar1[0x48] = 1;
          borg.temp.res_acid = true;
        }
        piVar1 = borg.trait;
        sVar8 = *(short *)((long)&pbVar21->el_info[3].res_level + lVar39);
        if (sVar8 == 3) {
          borg.trait[0x42] = 1;
          piVar1[0x46] = 1;
          borg.temp.res_cold = true;
        }
        piVar1 = borg.trait;
        sVar9 = *(short *)((long)&pbVar21->el_info[1].res_level + lVar39);
        if (sVar9 == 3) {
          borg.trait[0x43] = 1;
          piVar1[0x47] = 1;
          borg.temp.res_elec = true;
        }
        if (0 < sVar7) {
          borg.trait[0x48] = 1;
        }
        if (0 < sVar9) {
          borg.trait[0x47] = 1;
        }
        if (0 < sVar6) {
          borg.trait[0x45] = 1;
        }
        if (0 < sVar8) {
          borg.trait[0x46] = 1;
        }
        if (0 < *(short *)((long)&pbVar21->el_info[4].res_level + lVar39)) {
          borg.trait[0x49] = 1;
        }
        if (0 < *(short *)((long)&pbVar21->el_info[7].res_level + lVar39)) {
          borg.trait[0x4f] = 1;
        }
        if (0 < *(short *)((long)&pbVar21->el_info[5].res_level + lVar39)) {
          borg.trait[0x4b] = 1;
        }
        if (0 < *(short *)((long)&pbVar21->el_info[6].res_level + lVar39)) {
          borg.trait[0x4c] = 1;
        }
        if (0 < *(short *)((long)&pbVar21->el_info[0xb].res_level + lVar39)) {
          borg.trait[0x53] = 1;
        }
        if (0 < *(short *)((long)&pbVar21->el_info[0xc].res_level + lVar39)) {
          borg.trait[0x54] = 1;
        }
        if (0 < *(short *)((long)&pbVar21->el_info[8].res_level + lVar39)) {
          borg.trait[0x50] = 1;
        }
        if (0 < *(short *)((long)&pbVar21->el_info[9].res_level + lVar39)) {
          borg.trait[0x51] = 1;
        }
        if (0 < *(short *)((long)&pbVar21->el_info[10].res_level + lVar39)) {
          borg.trait[0x52] = 1;
        }
        _Var22 = flag_has_dbg(flags,5,1,"item->flags","OF_SUST_STR");
        if (_Var22) {
          borg.trait[0x14] = 1;
        }
        _Var22 = flag_has_dbg(flags,5,2,"item->flags","OF_SUST_INT");
        if (_Var22) {
          borg.trait[0x15] = 1;
        }
        _Var22 = flag_has_dbg(flags,5,3,"item->flags","OF_SUST_WIS");
        if (_Var22) {
          borg.trait[0x16] = 1;
        }
        _Var22 = flag_has_dbg(flags,5,4,"item->flags","OF_SUST_DEX");
        if (_Var22) {
          borg.trait[0x17] = 1;
        }
        local_38 = uVar36;
        _Var22 = flag_has_dbg(flags,5,5,"item->flags","OF_SUST_CON");
        if (_Var22) {
          borg.trait[0x18] = 1;
        }
        local_74 = 0 < *(short *)((long)&pbVar21->el_info[4].res_level + lVar39);
        local_76 = 0 < *(short *)((long)&pbVar21->el_info[7].res_level + lVar39);
        local_75 = 0 < *(short *)((long)&pbVar21->el_info[8].res_level + lVar39);
        local_77 = 0 < *(short *)((long)&pbVar21->el_info[9].res_level + lVar39);
        local_71 = 0 < *(short *)((long)&pbVar21->el_info[10].res_level + lVar39);
        local_73 = 0 < *(short *)((long)&pbVar21->el_info[0xb].res_level + lVar39);
        local_72 = 0 < *(short *)((long)&pbVar21->el_info[0xc].res_level + lVar39);
        local_5c = 0;
        if (((0 < *(short *)((long)&pbVar21->el_info[2].res_level + lVar39)) &&
            (0 < *(short *)((long)&pbVar21->el_info[3].res_level + lVar39))) &&
           (0 < *(short *)((long)&pbVar21->el_info[1].res_level + lVar39))) {
          local_5c = (uint)(0 < *(short *)((long)&pbVar21->el_info[0].res_level + lVar39));
        }
        local_68 = flags;
        _Var22 = flag_has_dbg(flags,5,1,"item->flags","OF_SUST_STR");
        if (((_Var22) && (_Var22 = flag_has_dbg(local_68,5,2,"item->flags","OF_SUST_INT"), _Var22))
           && (_Var22 = flag_has_dbg(local_68,5,3,"item->flags","OF_SUST_WIS"), _Var22)) {
          _Var22 = flag_has_dbg(local_68,5,4,"item->flags","OF_SUST_DEX");
          uVar29 = 0;
          if (_Var22) {
            _Var22 = flag_has_dbg(local_68,5,5,"item->flags","OF_SUST_CON");
            uVar29 = (uint)_Var22;
          }
        }
        else {
          uVar29 = 0;
        }
        iVar32 = (uint)local_72 + (uint)local_73 + (uint)local_71 +
                 (uint)local_77 + (uint)local_75 + (uint)local_76 + (uint)local_74 + local_5c +
                 uVar29;
        if (2 < iVar32) {
          borg.trait[0x102] = borg.trait[0x102] + iVar32;
        }
        if (((pbVar21->curses[lVar39 + -0x22] == false) &&
            (pbVar21->curses[lVar39 + -0x21] == false)) &&
           ((sVar6 = *(short *)(pbVar21->curses + lVar39 + -0x10), 0 < sVar6 &&
            (iVar32 = (int)*(short *)(pbVar21->curses + lVar39 + -0x12) + (int)sVar6,
            iVar32 == 0 ||
            SCARRY4((int)*(short *)(pbVar21->curses + lVar39 + -0x12),(int)sVar6) != iVar32 < 0))))
        {
          (pbVar21->curses + lVar39 + -0x12)[0] = true;
          (pbVar21->curses + lVar39 + -0x12)[1] = true;
        }
        piVar1 = borg.trait;
        local_6c = local_6c + local_58;
        iVar32 = (int)*(short *)(pbVar21->curses + lVar39 + -0x10) + borg.trait[0x85];
        local_70 = local_70 + local_54;
        borg.trait[0x85] = iVar32;
        piVar1[0x85] = *(short *)(pbVar21->curses + lVar39 + -0x12) + iVar32;
        uVar36 = local_38;
        if ((local_38 != z_info->pack_size) && (local_38 != (ulong)z_info->pack_size + 1)) {
          piVar1[0x86] = piVar1[0x86] + (int)*(short *)(pbVar21->curses + lVar39 + -0x16);
          piVar1[0x87] = piVar1[0x87] + (int)*(short *)(pbVar21->curses + lVar39 + -0x14);
        }
      }
    }
    piVar1 = borg.trait;
    uVar36 = uVar36 + 1;
    lVar39 = lVar39 + 0x388;
  } while (uVar36 < (ulong)z_info->pack_size + 0xc);
  if ((borg.trait[0x19] == 4) && (borg.trait[0x1a] < 1)) {
    borg.trait[0x1a] = 1;
  }
  if (piVar1[0xaf] != 0) {
    piVar1[0xae] = 1;
    piVar1[0x85] = piVar1[0x85] + -0x32;
  }
  if (piVar1[0xb0] != 0) {
    piVar1[0xb] = piVar1[0xb] + -5;
    piVar1[0xc] = piVar1[0xc] + -5;
  }
  if (piVar1[0xb1] != 0) {
    piVar1[10] = piVar1[10] + -5;
    piVar1[0xd] = piVar1[0xd] + -5;
    piVar1[0xe] = piVar1[0xe] + -5;
  }
  if (piVar1[0xb2] != 0) {
    piVar1[10] = piVar1[10] + -10;
  }
  if (piVar1[0xb3] != 0) {
    piVar1[0xd] = piVar1[0xd] + -10;
  }
  if (piVar1[0xb4] != 0) {
    piVar1[0x2c] = piVar1[0x2c] + -5;
  }
  if (piVar1[0xb5] != 0) {
    piVar1[0x2c] = piVar1[0x2c] + -10;
    piVar1[0x3a] = piVar1[0x3a] + -10;
    piVar1[0xae] = 1;
  }
  local_50 = *(undefined8 *)player->stat_cur;
  local_48 = player->stat_cur[4];
  lVar35 = 0;
  do {
    sVar6 = *(short *)((long)&local_50 + lVar35);
    iVar23 = modify_stat_value((int)sVar6,
                               *(int *)((long)player->race->r_adj + lVar35 * 2) +
                               *(int *)((long)borg.trait + lVar35 * 2 + 0x14) +
                               *(int *)((long)player->class->c_adj + lVar35 * 2));
    piVar1 = borg.trait;
    iVar32 = (int)iVar23;
    if (iVar23 < 0x13) {
      iVar30 = iVar32 + -3;
    }
    else {
      iVar30 = 0x25;
      if (iVar32 < 0xee) {
        iVar30 = (iVar32 - 0x12U) / 10 + 0xf;
      }
    }
    *(int *)((long)borg.trait + lVar35 * 2 + 0x3c) = iVar30;
    *(int *)((long)piVar1 + lVar35 * 2) = iVar32;
    *(int *)((long)piVar1 + lVar35 * 2 + 0x28) = (int)sVar6;
    lVar35 = lVar35 + 2;
  } while (lVar35 != 10);
  piVar1[0x1d] = (piVar1[0x23] * borg_adj_con_mhp[piVar1[0x13]]) / 100 +
                 (int)player->player_hp[(long)player->lev + -1];
  wVar25 = borg_spell_stat();
  piVar1 = borg.trait;
  if (L'\xffffffff' < wVar25) {
    borg.trait[0x20] =
         (((borg.trait[0x23] - (player->class->magic).spell_first) + 1) *
         borg_adj_mag_mana[borg.trait[(ulong)(uint)wVar25 + 0xf]]) / 2;
    piVar1[0x21] = borg_adj_mag_stat[piVar1[(ulong)(uint)wVar25 + 0xf]];
    piVar1[0x22] = borg_adj_mag_fail[piVar1[(ulong)(uint)wVar25 + 0xf]];
  }
  piVar1 = borg.trait;
  if (borg.trait[0x6f] != 0) {
    borg.trait[0x2c] = borg.trait[0x2c] + -10;
  }
  piVar1[0x85] = piVar1[0x85] + borg_adj_dex_ta[piVar1[0x12]];
  iVar32 = piVar1[0xf];
  piVar1[0x87] = piVar1[0x87] + borg_adj_str_td[iVar32];
  piVar1[0x86] = piVar1[0x86] + borg_adj_dex_th[piVar1[0x12]] + borg_adj_str_th[iVar32];
  iVar30 = adj_str_hold[iVar32];
  piVar1[0x3f] = piVar1[0x3f] + borg_adj_str_dig[iVar32];
  pbVar21 = borg_items;
  uVar36 = (ulong)z_info->pack_size;
  uVar3 = borg_items[uVar36 + 1].iqty;
  if ((uVar3 == '\0') ||
     (((borg_items[uVar36 + 1].art_idx == '\0' && (borg_items[uVar36 + 1].uncursable == false)) &&
      (borg_items[uVar36 + 1].cursed == true)))) {
    pbVar20 = borg_items + uVar36 + 1;
    pbVar20->dd = '\0';
    pbVar20->ds = '\0';
    pbVar21[uVar36 + 1].to_h = 0;
    pbVar21[uVar36 + 1].to_d = 0;
    pbVar21[uVar36 + 1].weight = 0;
    pbVar21[uVar36 + 1].ident = true;
    pbVar21[uVar36 + 1].sval = '\0';
  }
  piVar1[0x8e] = (int)pbVar21[uVar36 + 1].to_h;
  piVar1[0x8f] = (int)pbVar21[uVar36 + 1].to_d;
  piVar1[0x8d] = (uint)pbVar21[uVar36 + 1].ident;
  wVar25 = sv_sling;
  bVar4 = pbVar21[uVar36 + 1].sval;
  piVar1[0x90] = (uint)(sv_sling == (uint)bVar4);
  piVar1[0x91] = (uint)pbVar21[uVar36 + 1].art_idx;
  iVar32 = (int)pbVar21[uVar36 + 1].weight / 10;
  if (iVar30 < iVar32) {
    piVar1[0x96] = 1;
    piVar1[0x86] = piVar1[0x86] + (iVar30 - iVar32) * 2;
  }
  iVar37 = 1;
  if ((uVar3 == '\0') || (iVar30 < iVar32)) goto LAB_0024fbfe;
  iVar32 = 3;
  iVar37 = 2;
  if (wVar25 == (uint)bVar4) {
    iVar38 = 2;
LAB_0024fb67:
    piVar1[0x98] = iVar38;
    piVar1[0x99] = iVar32;
    piVar1[0x9a] = iVar37;
  }
  else {
    iVar32 = 4;
    iVar38 = 3;
    wVar25 = (wchar_t)bVar4;
    if (sv_short_bow == wVar25) goto LAB_0024fb67;
    iVar37 = 3;
    if (sv_long_bow == wVar25) {
      iVar38 = 3;
      goto LAB_0024fb67;
    }
    iVar32 = 5;
    iVar38 = 4;
    if ((sv_light_xbow == wVar25) || (iVar37 = 4, sv_heavy_xbow == wVar25)) goto LAB_0024fb67;
  }
  piVar1[0x9a] = piVar1[0x9a] + local_70;
  _Var22 = flag_has_dbg((player->state).pflags,3,1,"player->state.pflags","(PF_FAST_SHOT)");
  iVar32 = 1;
  if (_Var22) {
    iVar32 = 1;
    if (borg.trait[0x98] == 3) {
      iVar32 = (0x13 < borg.trait[0x23]) + 1;
    }
    iVar32 = (uint)(0x27 < borg.trait[0x23]) + iVar32;
    borg.trait[0x35] = 1;
  }
  iVar37 = 1;
  if (1 < iVar32 + local_6c) {
    iVar37 = iVar32 + local_6c;
  }
LAB_0024fbfe:
  piVar1 = borg.trait;
  borg.trait[0x94] = iVar37;
  item = (borg_item *)(borg_items + z_info->pack_size);
  uVar3 = borg_items[z_info->pack_size].iqty;
  if ((uVar3 == '\0') ||
     ((((borg_items != (borg_item_conflict *)0x0 && (item->art_idx == '\0')) &&
       (item->uncursable == false)) && (item->cursed == true)))) {
    item->dd = '\0';
    item->ds = '\0';
    item->to_h = 0;
    item->to_d = 0;
    item->weight = 0;
    item->ident = true;
  }
  piVar1[0x88] = (int)item->to_h;
  piVar1[0x89] = (int)item->to_d;
  piVar1[0x8a] = (uint)item->ident;
  piVar1[0x8b] = (uint)item->dd;
  piVar1[0x8c] = (uint)item->ds;
  iVar32 = (int)item->weight / 10;
  if (iVar30 < iVar32) {
    piVar1[0x95] = 1;
    piVar1[0x86] = piVar1[0x86] + (iVar30 - iVar32) * 2;
  }
  if ((uVar3 != '\0') && (iVar32 <= iVar30)) {
    wVar25 = borg_calc_blows(item);
    piVar1[0x92] = wVar25;
    piVar1[0x3f] = piVar1[0x3f] + iVar32;
  }
  _Var22 = flag_has_dbg((player->state).pflags,3,2,"player->state.pflags","(PF_BRAVERY_30)");
  if ((_Var22) && (0x1d < borg.trait[0x23])) {
    borg.trait[0x4a] = 1;
  }
  piVar1 = borg.trait;
  iVar32 = borg.trait[0x3a];
  borg.trait[0x3a] = iVar32 + 1;
  iVar30 = piVar1[0x24];
  iVar37 = piVar1[0x36];
  iVar38 = borg_adj_dex_dis[piVar1[0x12]];
  piVar1[0x36] = iVar37 + iVar38;
  iVar10 = piVar1[0x37];
  iVar11 = borg_adj_dex_dis[piVar1[0x10]];
  piVar1[0x37] = iVar10 + iVar11;
  iVar12 = piVar1[0x38];
  iVar13 = borg_adj_int_dev[piVar1[0x10]];
  piVar1[0x38] = iVar12 + iVar13;
  iVar14 = piVar1[0x39];
  iVar15 = borg_adj_wis_sav[piVar1[0x11]];
  piVar1[0x39] = iVar14 + iVar15;
  piVar1[0x36] = (local_40->x_skills[0] * iVar30) / 10 + iVar37 + iVar38;
  piVar1[0x37] = (local_40->x_skills[1] * iVar30) / 10 + iVar10 + iVar11;
  piVar1[0x38] = (local_40->x_skills[2] * iVar30) / 10 + iVar12 + iVar13;
  piVar1[0x39] = (local_40->x_skills[3] * iVar30) / 10 + iVar14 + iVar15;
  iVar32 = iVar32 + (local_40->x_skills[5] * iVar30) / 10 + 1;
  piVar1[0x3a] = iVar32;
  piVar1[0x3b] = piVar1[0x3b] + (local_40->x_skills[4] * iVar30) / 10;
  piVar1[0x3c] = piVar1[0x3c] + (local_40->x_skills[6] * iVar30) / 10;
  piVar1[0x3d] = piVar1[0x3d] + (local_40->x_skills[7] * iVar30) / 10;
  piVar1[0x3e] = piVar1[0x3e] + (iVar30 * local_40->x_skills[8]) / 10;
  if (0x1e < iVar32) {
    piVar1[0x3a] = 0x1e;
  }
  if (piVar1[0x3a] < 0) {
    piVar1[0x3a] = 0;
  }
  if (piVar1[0x3f] < 1) {
    piVar1[0x3f] = 1;
  }
  if ((piVar1[0x71] != 0) || (piVar1[0xba] != 0)) {
    piVar1[0x86] = piVar1[0x86] + -0x14;
    piVar1[0x85] = piVar1[0x85] + 8;
    piVar1[0x38] = (piVar1[0x38] * 0x5f) / 100;
  }
  _Var22 = flag_has_dbg((player->state).pflags,3,3,"player->state.pflags","(PF_BLESS_WEAPON)");
  if ((_Var22) &&
     ((item->tval == '\a' ||
      (_Var22 = flag_has_dbg(item->flags,5,0x12,"item->flags","OF_BLESSED"), _Var22)))) {
    piVar1 = borg.trait;
    borg.trait[0x86] = borg.trait[0x86] + 2;
    piVar1[0x87] = piVar1[0x87] + 2;
  }
  uVar31 = (ulong)z_info->pack_size;
  lVar35 = uVar31 * 0x388 + 0x5c;
  uVar36 = uVar31;
  do {
    pbVar21 = borg_items;
    if ((((borg_items->desc[lVar35 + 8] != '\0') && (borg_items->desc[lVar35] == '\x01')) &&
        ((borg_items == (borg_item_conflict *)0x0 ||
         (((borg_items->desc[lVar35 + 0xc] != '\0' || (borg_items->desc[lVar35 + 0x2d] != '\0')) ||
          (borg_items->desc[lVar35 + 0x2c] == '\0')))))) &&
       (((uVar36 != (int)uVar31 + 1 || (2 < borg.trait[0x9a])) ||
        ((borg_items->desc[lVar35 + 0xc] != '\0' || (borg_items->desc[lVar35 + 0xd] != '\0')))))) {
      _Var22 = borg_spell_legal_fail(ENCHANT_WEAPON,L'A');
      piVar2 = borg_cfg;
      piVar1 = borg.trait;
      if ((_Var22) || (0 < borg.trait[0xec])) {
        iVar32 = borg_cfg[0x1c] - (int)*(short *)(pbVar21->desc + lVar35 + 0x18);
        if (iVar32 != 0 && (int)*(short *)(pbVar21->desc + lVar35 + 0x18) <= borg_cfg[0x1c]) {
          borg.trait[0xf1] = borg.trait[0xf1] + iVar32;
        }
        iVar32 = piVar2[0x1c] - (int)*(short *)(pbVar21->desc + lVar35 + 0x1a);
        if (iVar32 != 0 && (int)*(short *)(pbVar21->desc + lVar35 + 0x1a) <= piVar2[0x1c]) {
          borg.trait[0xf2] = borg.trait[0xf2] + iVar32;
        }
      }
      else {
        if (*(short *)(pbVar21->desc + lVar35 + 0x18) < 8) {
          borg.trait[0xf1] = (borg.trait[0xf1] - (int)*(short *)(pbVar21->desc + lVar35 + 0x18)) + 8
          ;
        }
        if (*(short *)(pbVar21->desc + lVar35 + 0x1a) < 8) {
          piVar1[0xf2] = (piVar1[0xf2] - (int)*(short *)(pbVar21->desc + lVar35 + 0x1a)) + 8;
        }
      }
    }
    uVar24 = z_info->pack_size;
    uVar31 = (ulong)uVar24;
    lVar35 = lVar35 + 0x388;
    bVar19 = uVar36 <= uVar31;
    uVar36 = uVar36 + 1;
  } while (bVar19);
  if (uVar24 + 6 <= z_info->pack_size + 0xb) {
    uVar36 = (ulong)uVar24 + 5;
    lVar35 = (ulong)uVar24 * 0x388 + 0x15b9;
    do {
      pbVar21 = borg_items;
      if (((borg_items->desc[lVar35 + -0x25] != '\0') &&
          (borg_items->desc[lVar35 + -0x2d] == '\x01')) &&
         ((borg_items->desc[lVar35 + -0x21] != '\0' ||
          ((borg_items->desc[lVar35] != '\0' || (borg_items->desc[lVar35 + -1] == '\0')))))) {
        _Var22 = borg_spell_legal_fail(ENCHANT_ARMOUR,L'A');
        if ((_Var22) || (0 < borg.trait[0xee])) {
          iVar30 = (int)*(short *)(pbVar21->desc + lVar35 + -0x11);
          iVar32 = borg_cfg[0x1c] - iVar30;
          if (iVar32 != 0 && iVar30 <= borg_cfg[0x1c]) {
            borg.trait[0xf0] = borg.trait[0xf0] + iVar32;
          }
        }
        else {
          iVar32 = (int)*(short *)(pbVar21->desc + lVar35 + -0x11);
          if (iVar32 < 8) {
            borg.trait[0xf0] = (borg.trait[0xf0] - iVar32) + 8;
          }
        }
      }
      uVar36 = uVar36 + 1;
      lVar35 = lVar35 + 0x388;
    } while (uVar36 < (ulong)z_info->pack_size + 0xb);
  }
  if (0 < borg.see_inv) {
    borg.trait[0x33] = 1;
  }
  if ((borg.trait[0x69] == 0) && (_Var22 = borg_spell_legal(SENSE_INVISIBLE), _Var22)) {
    borg.trait[0x33] = 1;
  }
  piVar1 = borg.trait;
  if (99 < borg.trait[0x39]) {
    borg.trait[0x56] = 1;
  }
  if (((99 < piVar1[0x39]) && (piVar1[0x4c] != 0)) && (piVar1[0x4b] != 0)) {
    piVar1[0x4d] = 1;
  }
  if (z_info->quiver_size != 0) {
    wVar25 = (uint)z_info->pack_size + L'\f';
    do {
      borg_notice_ammo(wVar25);
      wVar25 = wVar25 + L'\x01';
    } while ((uint)wVar25 < (uint)((uint)z_info->quiver_size + (uint)z_info->pack_size + L'\f'));
  }
  borg.need_statgain[0] = false;
  borg.need_statgain[1] = false;
  borg.need_statgain[2] = false;
  borg.need_statgain[3] = false;
  borg.need_statgain[4] = false;
  borg.amt_statgain[4] = 0;
  borg.amt_statgain[0] = 0;
  borg.amt_statgain[1] = 0;
  borg.amt_statgain[2] = 0;
  borg.amt_statgain[3] = 0;
  borg.amt_book[0] = 0;
  borg.amt_book[1] = 0;
  borg.amt_book[2] = 0;
  borg.amt_book[3] = 0;
  borg.amt_book[4] = 0;
  borg.amt_book[5] = 0;
  borg.amt_book[6] = 0;
  borg.amt_book[7] = 0;
  borg.amt_book[8] = 0;
  if (borg.trait[0x9e] < (int)(uint)z_info->pack_size) {
    lVar39 = 0;
    lVar35 = 0;
    do {
      pbVar21 = borg_items;
      if (borg_items->curses[lVar39 + -0x26] == false) {
        borg.trait[0x106] = borg.trait[0x106] + 1;
      }
      else {
        _Var22 = borg_is_ammo((uint)borg_items->curses[lVar39 + -0x2a]);
        if (_Var22) {
          borg_notice_ammo((wchar_t)lVar35);
        }
        else {
          iVar23 = borg_item_weight((borg_item_conflict *)(pbVar21->desc + lVar39));
          borg.trait[0x104] = borg.trait[0x104] + (int)iVar23;
          _Var22 = borg_item_note_needs_id((borg_item_conflict *)(pbVar21->desc + lVar39));
          if (_Var22) {
            borg.trait[0xfe] = borg.trait[0xfe] + 1;
          }
          piVar1 = borg.trait;
          _Var22 = pbVar21->curses[lVar39 + -1];
          if ((_Var22 == true) && (borg.trait[0xa0] = borg.trait[0xa0] | 1, piVar1[0x9f] == 0)) {
            piVar1[0x9f] = (wchar_t)lVar35 + L'\x01';
          }
          if (pbVar21->curses[lVar39 + -0x2c] == true) {
            _Var5 = pbVar21->curses[lVar39 + -0x26];
            uVar29 = (uint)_Var5;
            borg.has[*(uint *)(pbVar21->curses + lVar39 + -0x32)] =
                 borg.has[*(uint *)(pbVar21->curses + lVar39 + -0x32)] + (uint)_Var5;
            piVar1 = borg.trait;
            if (((pbVar21 == (borg_item_conflict *)0x0) || (_Var5 == false)) ||
               ((pbVar21->curses[lVar39 + -0x22] != false || _Var22 != false ||
                (pbVar21->curses[lVar39 + -2] == false)))) {
              _Var22 = pbVar21->curses[lVar39 + -0x2a];
              if (_Var22 - 6 < 0x1d) {
                uVar26 = (uint)_Var5;
                uVar27 = (uint)_Var5;
                uVar28 = (uint)_Var5;
                switch((uint)_Var22) {
                case 6:
                  if (((0 < *(int *)(pbVar21->curses + lVar39 + -6)) &&
                      (pbVar21->curses[lVar39 + -2] == false)) && (0xc < borg.trait[0x3f])) {
                    borg.trait[0xff] = borg.trait[0xff] + uVar28;
                  }
                  break;
                case 0x13:
                  if ((((sv_light_torch == (uint)pbVar21->curses[lVar39 + -0x29]) &&
                       (0 < *(short *)(pbVar21->curses + lVar39 + -0x18))) &&
                      (sv_light_torch == (uint)borg_items[(ulong)z_info->pack_size + 5].sval)) &&
                     (borg_items[(ulong)z_info->pack_size + 5].iqty != '\0')) {
LAB_0025056f:
                    borg.trait[0xd5] = borg.trait[0xd5] + uVar27;
                  }
                  break;
                case 0x16:
                  _Var5 = pbVar21->curses[lVar39 + -0x29];
                  if (sv_staff_teleportation == (uint)_Var5) {
                    borg.trait[0xd4] = borg.trait[0xd4] + uVar27;
                    wVar25 = borg_activate_failure((uint)_Var22,(uint)_Var5);
                    if (wVar25 < L'Ǵ') {
                      borg.trait[0xd4] =
                           borg.trait[0xd4] + (int)*(short *)(pbVar21->curses + lVar39 + -0x28);
                    }
                  }
                  else if (sv_staff_speed == (uint)_Var5) {
                    uVar29 = (uint)*(short *)(pbVar21->curses + lVar39 + -0x28);
LAB_0025078e:
                    borg.trait[0xda] = borg.trait[0xda] + uVar29;
                  }
                  else {
                    wVar25 = (wchar_t)_Var5;
                    if (sv_staff_healing == wVar25) {
                      uVar29 = (uint)*(short *)(pbVar21->curses + lVar39 + -0x28);
                      goto LAB_00250809;
                    }
                    if (sv_staff_the_magi == wVar25) {
                      borg.trait[0xdb] =
                           borg.trait[0xdb] + (int)*(short *)(pbVar21->curses + lVar39 + -0x28);
                    }
                    else if (sv_staff_destruction == wVar25) {
                      borg.trait[0xdc] =
                           borg.trait[0xdc] + (int)*(short *)(pbVar21->curses + lVar39 + -0x28);
                    }
                    else if (sv_staff_power == wVar25) {
                      borg.trait[0x100] = borg.trait[0x100] + uVar28;
                    }
                    else if (sv_staff_holiness == (uint)_Var5) {
                      borg.trait[0x100] = borg.trait[0x100] + uVar28;
                      uVar29 = (uint)*(short *)(pbVar21->curses + lVar39 + -0x28);
                      goto LAB_00250809;
                    }
                  }
                  break;
                case 0x17:
                  _Var22 = pbVar21->curses[lVar39 + -0x29];
                  if (sv_wand_teleport_away == (uint)_Var22) {
                    borg.trait[0xdd] =
                         borg.trait[0xdd] + (int)*(short *)(pbVar21->curses + lVar39 + -0x28);
                  }
                  if ((sv_wand_stinking_cloud == (uint)_Var22) && (borg.trait[0x6a] < 0x1e)) {
                    borg.trait[0x101] =
                         borg.trait[0x101] + (int)*(short *)(pbVar21->curses + lVar39 + -0x28);
                  }
                  if ((sv_wand_magic_missile == (uint)_Var22) && (borg.trait[0x6a] < 0x1e)) {
                    borg.trait[0x101] =
                         borg.trait[0x101] + (int)*(short *)(pbVar21->curses + lVar39 + -0x28);
                  }
                  if (sv_wand_annihilation == (uint)_Var22) {
                    borg.trait[0x101] =
                         borg.trait[0x101] + (int)*(short *)(pbVar21->curses + lVar39 + -0x28);
                  }
                  break;
                case 0x18:
                  _Var22 = pbVar21->curses[lVar39 + -0x29];
                  wVar25 = (wchar_t)_Var22;
                  if (sv_rod_recall == (uint)_Var22) {
                    wVar25 = borg_activate_failure(L'\x18',wVar25);
                    if (wVar25 < L'Ǵ') {
                      borg.trait[0x26] =
                           borg.trait[0x26] + (uint)pbVar21->curses[lVar39 + -0x26] * 100;
                    }
                    else {
                      borg.trait[0x26] = borg.trait[0x26] + (uint)pbVar21->curses[lVar39 + -0x26];
                    }
                  }
                  else if (sv_rod_detection == (uint)_Var22) {
                    iVar32 = uVar28 * 100;
                    borg.trait[0xdf] = borg.trait[0xdf] + iVar32;
                    piVar1[0xe0] = piVar1[0xe0] + iVar32;
                    piVar1[0xe1] = piVar1[0xe1] + iVar32;
                  }
                  else {
                    wVar33 = (wchar_t)_Var22;
                    if (sv_rod_illumination == wVar33) {
                      borg.trait[0xe4] = borg.trait[0xe4] + uVar28 * 100;
                    }
                    else if (sv_rod_speed == wVar33) {
                      wVar25 = borg_activate_failure(L'\x18',wVar25);
                      if (wVar25 < L'Ǵ') {
                        borg.trait[0xda] =
                             borg.trait[0xda] + (uint)pbVar21->curses[lVar39 + -0x26] * 100;
                      }
                      else {
                        borg.trait[0xda] = borg.trait[0xda] + (uint)pbVar21->curses[lVar39 + -0x26];
                      }
                    }
                    else if (sv_rod_mapping == wVar33) {
                      borg.trait[0xe2] = borg.trait[0xe2] + uVar27 * 100;
                    }
                    else if (sv_rod_healing == wVar33) {
                      wVar25 = borg_activate_failure(L'\x18',wVar25);
                      if (wVar25 < L'Ǵ') {
                        borg.trait[0xd6] =
                             borg.trait[0xd6] + (uint)pbVar21->curses[lVar39 + -0x26] * 3;
                      }
                      else {
                        borg.trait[0xd6] =
                             (uint)pbVar21->curses[lVar39 + -0x26] + borg.trait[0xd6] + 1;
                      }
                    }
                    else if ((((sv_rod_light == wVar33) || (sv_rod_fire_bolt == wVar33)) ||
                             (sv_rod_elec_bolt == wVar33)) ||
                            ((sv_rod_cold_bolt == wVar33 || (sv_rod_acid_bolt == wVar25)))) {
                      borg.trait[0xfb] = borg.trait[0xfb] + uVar27;
                    }
                    else if (((sv_rod_drain_life == wVar25) || (sv_rod_fire_ball == wVar25)) ||
                            ((sv_rod_elec_ball == wVar25 ||
                             ((sv_rod_cold_ball == wVar25 || (sv_rod_acid_ball == wVar25)))))) {
                      borg.trait[0xfc] = borg.trait[0xfc] + uVar27;
                    }
                  }
                  break;
                case 0x19:
                  _Var22 = pbVar21->curses[lVar39 + -0x29];
                  if (sv_scroll_identify == (uint)_Var22) {
                    borg.trait[0xd9] = borg.trait[0xd9] + uVar27;
                  }
                  else if (sv_scroll_recharging == (uint)_Var22) {
                    borg.trait[0xe3] = borg.trait[0xe3] + uVar27;
                  }
                  else {
                    wVar25 = (wchar_t)_Var22;
                    if (sv_scroll_phase_door == wVar25) {
                      borg.trait[0xd2] = borg.trait[0xd2] + uVar27;
                    }
                    else if (sv_scroll_teleport == wVar25) {
                      borg.trait[0xd3] = borg.trait[0xd3] + uVar27;
                    }
                    else if (sv_scroll_word_of_recall == wVar25) {
                      borg.trait[0x26] = borg.trait[0x26] + uVar27;
                    }
                    else if (sv_scroll_enchant_armor == wVar25) {
                      borg.trait[0xed] = borg.trait[0xed] + uVar27;
                    }
                    else {
                      wVar25 = (wchar_t)_Var22;
                      if (sv_scroll_star_enchant_armor == wVar25) {
                        borg.trait[0xee] = borg.trait[0xee] + uVar27;
                      }
                      else if (sv_scroll_enchant_weapon_to_hit == wVar25) {
                        borg.trait[0xea] = borg.trait[0xea] + uVar27;
                      }
                      else if (sv_scroll_enchant_weapon_to_dam == wVar25) {
                        borg.trait[0xeb] = borg.trait[0xeb] + uVar27;
                      }
                      else if (sv_scroll_star_enchant_weapon == wVar25) {
                        borg.trait[0xec] = borg.trait[0xec] + uVar27;
                      }
                      else if (sv_scroll_protection_from_evil == wVar25) {
                        borg.trait[0xe5] = borg.trait[0xe5] + uVar27;
                      }
                      else if (sv_scroll_rune_of_protection == wVar25) {
                        borg.trait[0xe6] = borg.trait[0xe6] + uVar26;
                      }
                      else if (sv_scroll_teleport_level == wVar25) {
                        borg.trait[0xf7] = borg.trait[0xf7] + uVar26;
                        piVar1[0xd3] = piVar1[0xd3] + 1;
                      }
                      else if (sv_scroll_mass_banishment == wVar25) {
                        borg.trait[0xf9] = borg.trait[0xf9] + uVar26;
                      }
                    }
                  }
                  break;
                case 0x1a:
                  _Var22 = pbVar21->curses[lVar39 + -0x29];
                  if (sv_potion_healing == (uint)_Var22) {
LAB_00250809:
                    piVar1[0xd6] = piVar1[0xd6] + uVar29;
                  }
                  else if (sv_potion_star_healing == (uint)_Var22) {
                    borg.trait[0xd7] = borg.trait[0xd7] + uVar26;
                  }
                  else {
                    wVar25 = (wchar_t)_Var22;
                    if (sv_potion_life == wVar25) {
                      borg.trait[0xd8] = borg.trait[0xd8] + uVar26;
                    }
                    else if (sv_potion_cure_critical == wVar25) {
                      borg.trait[0xe7] = borg.trait[0xe7] + uVar26;
                    }
                    else if (sv_potion_cure_serious == wVar25) {
                      borg.trait[0xe8] = borg.trait[0xe8] + uVar26;
                    }
                    else if (sv_potion_cure_light == wVar25) {
                      borg.trait[0xe9] = borg.trait[0xe9] + uVar26;
                    }
                    else {
                      wVar25 = (wchar_t)_Var22;
                      if (sv_potion_cure_poison == wVar25) {
                        borg.trait[0xde] = borg.trait[0xde] + uVar26;
                      }
                      else if (sv_potion_resist_heat == wVar25) {
                        borg.trait[0xf4] = borg.trait[0xf4] + uVar26;
                      }
                      else if (sv_potion_resist_cold == wVar25) {
                        borg.trait[0xf5] = borg.trait[0xf5] + uVar28;
                      }
                      else if (sv_potion_resist_pois == wVar25) {
                        borg.trait[0xf6] = borg.trait[0xf6] + uVar28;
                      }
                      else {
                        uVar24 = (ushort)_Var5;
                        if (sv_potion_inc_str == wVar25) {
                          borg.amt_statgain[0] = borg.amt_statgain[0] + uVar24;
                        }
                        else if (sv_potion_inc_int == wVar25) {
                          borg.amt_statgain[1] = borg.amt_statgain[1] + uVar24;
                        }
                        else if (sv_potion_inc_wis == wVar25) {
                          borg.amt_statgain[2] = borg.amt_statgain[2] + uVar24;
                        }
                        else if (sv_potion_inc_dex == wVar25) {
                          borg.amt_statgain[3] = borg.amt_statgain[3] + uVar24;
                        }
                        else {
                          wVar25 = (wchar_t)_Var22;
                          if (sv_potion_inc_con != wVar25) {
                            if (sv_potion_inc_all != wVar25) {
                              if (sv_potion_restore_life == wVar25) {
                                borg.trait[0x7e] = 1;
                              }
                              else if (sv_potion_speed == wVar25) goto LAB_0025078e;
                              break;
                            }
                            borg.amt_statgain[0] = borg.amt_statgain[0] + uVar24;
                            borg.amt_statgain[1] = borg.amt_statgain[1] + uVar24;
                            borg.amt_statgain[2] = borg.amt_statgain[2] + uVar24;
                            borg.amt_statgain[3] = borg.amt_statgain[3] + uVar24;
                          }
                          borg.amt_statgain[4] = borg.amt_statgain[4] + uVar24;
                        }
                      }
                    }
                  }
                  break;
                case 0x1b:
                  if (sv_light_lantern == (uint)borg_items[(ulong)z_info->pack_size + 5].sval)
                  goto LAB_0025056f;
                  break;
                case 0x1c:
switchD_0025039d_caseD_1c:
                  _Var22 = borg_obj_has_effect(*(uint32_t *)(pbVar21->curses + lVar39 + -0x32),L'\a'
                                               ,L'\xffffffff');
                  if ((!_Var22) &&
                     (_Var22 = borg_obj_has_effect(*(uint32_t *)(pbVar21->curses + lVar39 + -0x32),
                                                   L'\n',L'\x04'), !_Var22)) {
                    if (pbVar21->curses[lVar39 + -0x2a] == true) {
                      _Var22 = borg_obj_has_effect(*(uint32_t *)(pbVar21->curses + lVar39 + -0x32),
                                                   L'\x06',L'\0');
                      lVar34 = 0xa4;
                      if (_Var22) {
LAB_0025090a:
                        *(int *)((long)borg.trait + lVar34) =
                             *(int *)((long)borg.trait + lVar34) +
                             (uint)pbVar21->curses[lVar39 + -0x26];
                      }
                    }
                    else {
                      _Var22 = pbVar21->curses[lVar39 + -0x29];
                      lVar34 = 0xa4;
                      if ((((((sv_food_apple == (uint)_Var22) || (sv_food_handful == (uint)_Var22))
                            || (wVar25 = (wchar_t)_Var22, sv_food_slime_mold == wVar25)) ||
                           (((sv_food_pint == wVar25 || (sv_food_sip == wVar25)) ||
                            ((lVar34 = 0xa0, sv_food_ration == wVar25 ||
                             ((wVar25 = (wchar_t)_Var22, sv_food_slice == wVar25 ||
                              (sv_food_honey_cake == wVar25)))))))) || (sv_food_waybread == wVar25))
                         || (sv_food_draught == wVar25)) goto LAB_0025090a;
                    }
                    _Var22 = borg_obj_has_effect(*(uint32_t *)(pbVar21->curses + lVar39 + -0x32),
                                                 L'\b',L'\a');
                    if (_Var22) {
                      borg.trait[0xde] = borg.trait[0xde] + (uint)pbVar21->curses[lVar39 + -0x26];
                    }
                    _Var22 = borg_obj_has_effect(*(uint32_t *)(pbVar21->curses + lVar39 + -0x32),
                                                 L'\b',L'\x04');
                    if (_Var22) {
                      borg.trait[0x2a] = borg.trait[0x2a] + (uint)pbVar21->curses[lVar39 + -0x26];
                    }
                    _Var22 = borg_obj_has_effect(*(uint32_t *)(pbVar21->curses + lVar39 + -0x32),
                                                 L'\b',L'\x02');
                    if (_Var22) {
                      borg.trait[0x2b] = borg.trait[0x2b] + (uint)pbVar21->curses[lVar39 + -0x26];
                    }
                  }
                  break;
                case 0x1d:
                  _Var22 = pbVar21->curses[lVar39 + -0x29];
                  wVar25 = (wchar_t)_Var22;
                  if ((((sv_mush_purging != (uint)_Var22) && (sv_mush_restoring != (uint)_Var22)) &&
                      (sv_mush_cure_mind != wVar25)) ||
                     ((borg_cfg[1] == 0 || (borg_cfg[2] <= borg.trait[0x24])))) {
                    if (((((sv_mush_second_sight == wVar25) ||
                          ((wVar33 = (wchar_t)_Var22, sv_mush_emergency == wVar33 ||
                           (sv_mush_terror == wVar33)))) || (sv_mush_stoneskin == wVar33)) ||
                        ((sv_mush_debility == wVar33 || (sv_mush_sprinting == wVar25)))) &&
                       ((borg_cfg[1] != 0 && (borg_cfg[2] <= borg.trait[0x24])))) {
                      borg.trait[0xfa] = borg.trait[0xfa] + (uint)_Var5;
                    }
                    goto switchD_0025039d_caseD_1c;
                  }
                  break;
                case 0x1e:
                case 0x1f:
                case 0x20:
                case 0x21:
                case 0x22:
                  _Var22 = obj_kind_can_browse(k_info + *(uint *)(pbVar21->curses + lVar39 + -0x32))
                  ;
                  if (_Var22) {
                    _Var22 = pbVar21->curses[lVar39 + -0x26];
                    wVar25 = borg_get_book_num((uint)pbVar21->curses[lVar39 + -0x29]);
                    borg.amt_book[wVar25] = borg.amt_book[wVar25] + (ushort)_Var22;
                  }
                }
              }
            }
          }
        }
      }
      lVar35 = lVar35 + 1;
      lVar39 = lVar39 + 0x388;
    } while (lVar35 < (long)((ulong)z_info->pack_size - (long)borg.trait[0x9e]));
  }
  iVar32 = borg.has[kv_flask_oil];
  if ((iVar32 != 0) && (borg.trait[0x23] < 0xf)) {
    iVar30 = 0xf;
    if (iVar32 < 0xf) {
      iVar30 = iVar32;
    }
    borg.trait[0x9b] = borg.trait[0x9b] + iVar30;
  }
  _Var22 = borg_spell_legal_fail(REMOVE_HUNGER,L'P');
  if ((_Var22) || (_Var22 = borg_spell_legal_fail(HERBAL_CURING,L'P'), _Var22)) {
    borg.trait[0x27] = borg.trait[0x27] + 1000;
  }
  _Var22 = borg_spell_legal(IDENTIFY_RUNE);
  if (_Var22) {
    borg.trait[0xd9] = borg.trait[0xd9] + 1000;
  }
  _Var22 = borg_spell_legal(FIND_TRAPS_DOORS_STAIRS);
  if ((_Var22) || (_Var22 = borg_spell_legal(DETECTION), _Var22)) {
    borg.trait[0xdf] = 1000;
  }
  _Var22 = borg_spell_legal(REVEAL_MONSTERS);
  if ((((_Var22) || (_Var22 = borg_spell_legal(DETECT_LIFE), _Var22)) ||
      (_Var22 = borg_spell_legal(DETECT_EVIL), _Var22)) ||
     (((_Var22 = borg_spell_legal(READ_MINDS), _Var22 ||
       (_Var22 = borg_spell_legal(DETECT_MONSTERS), _Var22)) ||
      (_Var22 = borg_spell_legal(SEEK_BATTLE), _Var22)))) {
    borg.trait[0xe1] = 1000;
  }
  _Var22 = borg_spell_legal(DETECTION);
  if (((_Var22) || (_Var22 = borg_equips_item(act_enlightenment,false), _Var22)) ||
     (_Var22 = borg_equips_item(act_clairvoyance,false), _Var22)) {
    piVar1 = borg.trait;
    piVar1[0xdf] = 1000;
    piVar1[0xe0] = 1000;
    piVar1[0xe1] = 1000;
  }
  _Var22 = borg_spell_legal(SENSE_INVISIBLE);
  if (_Var22) {
    borg.trait[0x103] = 1;
  }
  _Var22 = borg_spell_legal(SENSE_SURROUNDINGS);
  if (((_Var22) || (_Var22 = borg_equips_item(act_detect_all,false), _Var22)) ||
     (_Var22 = borg_equips_item(act_mapping,false), _Var22)) {
    piVar1 = borg.trait;
    piVar1[0xdf] = 1000;
    piVar1[0xe0] = 1000;
    piVar1[0xe2] = 1000;
  }
  _Var22 = borg_spell_legal(LIGHT_ROOM);
  if (((_Var22) || (_Var22 = borg_equips_item(act_light,false), _Var22)) ||
     ((_Var22 = borg_equips_item(act_illumination,false), _Var22 ||
      (_Var22 = borg_spell_legal(CALL_LIGHT), _Var22)))) {
    borg.trait[0xe4] = borg.trait[0xe4] + 1000;
  }
  _Var22 = borg_spell_legal(PROTECTION_FROM_EVIL);
  if (((_Var22) || (_Var22 = borg_equips_item(act_protevil,false), _Var22)) ||
     ((borg.has[kv_staff_holiness] != 0 || (_Var22 = borg_equips_item(act_staff_holy,false), _Var22)
      ))) {
    borg.trait[0xe5] = borg.trait[0xe5] + 1000;
  }
  _Var22 = borg_spell_legal(GLYPH_OF_WARDING);
  if ((_Var22) || (_Var22 = borg_equips_item(act_glyph,false), _Var22)) {
    borg.trait[0xe6] = borg.trait[0xe6] + 1000;
  }
  _Var22 = borg_spell_legal(FIND_TRAPS_DOORS_STAIRS);
  if (_Var22) {
    piVar1 = borg.trait;
    piVar1[0xdf] = 1000;
    piVar1[0xe0] = 1000;
  }
  _Var22 = borg_spell_legal_fail(ENCHANT_WEAPON,L'A');
  if ((_Var22) || (_Var22 = borg_equips_item(act_enchant_weapon,false), _Var22)) {
    piVar2 = borg.trait;
    borg.trait[0xea] = borg.trait[0xea] + 1000;
    piVar1 = piVar2 + 0xeb;
    *piVar1 = *piVar1 + 1000;
    piVar2 = piVar2 + 0xec;
    *piVar2 = *piVar2 + 1000;
  }
  _Var22 = borg_equips_item(act_enchant_tohit,false);
  if (_Var22) {
    borg.trait[0xea] = borg.trait[0xea] + 1000;
  }
  _Var22 = borg_equips_item(act_enchant_todam,false);
  if (_Var22) {
    borg.trait[0xeb] = borg.trait[0xeb] + 1000;
  }
  _Var22 = borg_equips_item(act_firebrand,false);
  if ((_Var22) || (_Var22 = borg_spell_legal_fail(BRAND_AMMUNITION,L'A'), _Var22)) {
    borg.trait[0xef] = borg.trait[0xef] + 1000;
  }
  _Var22 = borg_spell_legal_fail(ENCHANT_ARMOUR,L'A');
  if (((_Var22) || (_Var22 = borg_equips_item(act_enchant_armor,false), _Var22)) ||
     (_Var22 = borg_equips_item(act_enchant_armor2,false), _Var22)) {
    piVar1 = borg.trait;
    borg.trait[0xed] = borg.trait[0xed] + 1000;
    piVar1[0xee] = piVar1[0xee] + 1000;
  }
  _Var22 = borg_spell_legal_fail(TURN_STONE_TO_MUD,L'(');
  if (((_Var22) || (_Var22 = borg_equips_item(act_stone_to_mud,false), _Var22)) ||
     (_Var22 = borg_equips_ring(sv_ring_digging), _Var22)) {
    borg.trait[0xff] = borg.trait[0xff] + 1;
  }
  _Var22 = borg_spell_legal_fail(WORD_OF_RECALL,L'(');
  if ((_Var22) || ((borg.trait[0x69] == 100 && (_Var22 = borg_spell_legal(WORD_OF_RECALL), _Var22)))
     ) {
    borg.trait[0x26] = borg.trait[0x26] + 1000;
  }
  _Var22 = borg_equips_item(act_recall,false);
  if (_Var22) {
    borg.trait[0x26] = borg.trait[0x26] + 1;
  }
  _Var22 = borg_spell_legal_fail(TELEPORT_LEVEL,L'\x14');
  if (_Var22) {
    borg.trait[0xf7] = borg.trait[0xf7] + 1000;
  }
  _Var22 = borg_spell_legal_fail(PHASE_DOOR,L'\x03');
  if (_Var22) {
    borg.trait[0xd2] = borg.trait[0xd2] + 1000;
  }
  _Var22 = borg_equips_item(act_tele_phase,false);
  if (_Var22) {
    borg.trait[0xd2] = borg.trait[0xd2] + 1;
  }
  _Var22 = borg_spell_legal_fail(TELEPORT_SELF,L'\x01');
  if ((((_Var22) || (_Var22 = borg_spell_legal_fail(PORTAL,L'\x01'), _Var22)) ||
      (_Var22 = borg_spell_legal_fail(SHADOW_SHIFT,L'\x01'), _Var22)) ||
     (_Var22 = borg_spell_legal_fail(DIMENSION_DOOR,L'\x01'), _Var22)) {
    borg.trait[0xd3] = borg.trait[0xd3] + 1000;
  }
  _Var22 = borg_equips_item(act_tele_long,false);
  piVar1 = borg.trait;
  if (_Var22) {
    borg.trait[0xd4] = borg.trait[0xd4] + 1;
    piVar1[0xd3] = piVar1[0xd3] + 1;
  }
  _Var22 = borg_spell_legal_fail(TELEPORT_OTHER,L'(');
  if (_Var22) {
    borg.trait[0xdd] = borg.trait[0xdd] + 1000;
  }
  _Var22 = borg_spell_legal(HOLY_WORD);
  if (_Var22) {
    borg.trait[0xf8] = borg.trait[0xf8] + 1000;
  }
  _Var22 = borg_spell_legal(HASTE_SELF);
  if (((_Var22) || (_Var22 = borg_equips_item(act_haste,false), _Var22)) ||
     ((_Var22 = borg_equips_item(act_haste1,false), _Var22 ||
      (_Var22 = borg_equips_item(act_haste2,false), _Var22)))) {
    borg.trait[0xda] = borg.trait[0xda] + 1000;
  }
  _Var22 = borg_equips_item(act_cure_light,false);
  if (_Var22) {
    borg.trait[0xe9] = borg.trait[0xe9] + 1000;
  }
  _Var22 = borg_equips_item(act_cure_serious,false);
  if (_Var22) {
    borg.trait[0xe8] = borg.trait[0xe8] + 1000;
  }
  _Var22 = borg_equips_item(act_cure_critical,false);
  if (_Var22) {
    borg.trait[0xe7] = borg.trait[0xe7] + 1000;
  }
  _Var22 = borg_equips_item(act_cure_full,false);
  if (((_Var22) || (_Var22 = borg_equips_item(act_cure_full2,false), _Var22)) ||
     (((_Var22 = borg_equips_item(act_cure_nonorlybig,false), _Var22 ||
       (((_Var22 = borg_equips_item(act_heal1,false), _Var22 ||
         (_Var22 = borg_equips_item(act_heal2,false), _Var22)) ||
        (_Var22 = borg_equips_item(act_heal3,false), _Var22)))) ||
      (_Var22 = borg_spell_legal(HEALING), _Var22)))) {
    borg.trait[0xd6] = borg.trait[0xd6] + 1000;
  }
  _Var22 = borg_equips_item(act_cure_nonorlybig,false);
  if (((_Var22) || (_Var22 = borg_equips_item(act_restore_exp,false), _Var22)) ||
     ((_Var22 = borg_equips_item(act_restore_st_lev,false), _Var22 ||
      (_Var22 = borg_equips_item(act_restore_life,false), _Var22)))) {
    borg.trait[0x7e] = 1;
  }
  _Var22 = borg_spell_legal(REMEMBRANCE);
  if (((_Var22) || (_Var22 = borg_equips_item(act_cure_nonorlybig,false), _Var22)) ||
     ((_Var22 = borg_equips_item(act_restore_exp,false), _Var22 ||
      ((_Var22 = borg_equips_item(act_restore_st_lev,false), _Var22 ||
       (_Var22 = borg_equips_item(act_restore_life,false), _Var22)))))) {
    borg.trait[0x55] = 1;
  }
  _Var22 = borg_equips_item(act_recharge,false);
  if ((_Var22) || (_Var22 = borg_spell_legal(RECHARGING), _Var22)) {
    borg.trait[0xe3] = borg.trait[0xe3] + 1000;
  }
  _Var22 = flag_has_dbg(borg_items[(ulong)z_info->pack_size + 5].flags,5,0x15,
                        "borg_items[INVEN_LIGHT].flags","OF_NO_FUEL");
  if ((_Var22) || (borg.trait[0x19] == 4)) {
    borg.trait[0xd5] = borg.trait[0xd5] + 1000;
  }
  piVar1 = borg.trait;
  if (borg.trait[10] < 0x76) {
    borg.need_statgain[0] = true;
  }
  if (borg.trait[0xb] < 0x76) {
    borg.need_statgain[1] = true;
  }
  if (borg.trait[0xc] < 0x76) {
    borg.need_statgain[2] = true;
  }
  if (borg.trait[0xd] < 0x76) {
    borg.need_statgain[3] = true;
  }
  if (borg.trait[0xe] < 0x76) {
    borg.need_statgain[4] = true;
  }
  if (borg.trait[0x7d] == 0) {
    borg.trait[0x7e] = 1;
  }
  iVar32 = piVar1[0x27] + piVar1[0x28] + piVar1[0x29];
  piVar1[0x27] = iVar32;
  if ((piVar1[0x6c] != 0) && (999 < iVar32)) {
    piVar1[0x27] = iVar32 + -1000;
  }
  if ((char)local_60 != '\0') {
    borg_notice_weapon_swap();
    borg_notice_armour_swap();
  }
  uVar26 = 1;
  uVar29 = 1;
  if (((borg.trait[0x48] == 0) && (uVar29 = 1, armour_swap_resist_acid == '\0')) &&
     (uVar29 = 1, weapon_swap_resist_acid == '\0')) {
    _Var22 = borg_spell_legal_fail(RESISTANCE,L'\x0f');
    uVar29 = (uint)_Var22;
  }
  piVar1 = borg.trait;
  borg.trait[0x5a] = uVar29;
  if (((piVar1[0x47] == 0) && (armour_swap_resist_elec == '\0')) &&
     (weapon_swap_resist_elec == '\0')) {
    _Var22 = borg_spell_legal_fail(RESISTANCE,L'\x0f');
    uVar26 = (uint)_Var22;
  }
  piVar1 = borg.trait;
  borg.trait[0x59] = uVar26;
  uVar26 = 1;
  uVar29 = 1;
  if (((piVar1[0x45] == 0) && (uVar29 = 1, armour_swap_resist_fire == '\0')) &&
     (uVar29 = 1, weapon_swap_resist_fire == '\0')) {
    _Var22 = borg_spell_legal_fail(RESISTANCE,L'\x0f');
    uVar29 = (uint)_Var22;
  }
  piVar1 = borg.trait;
  borg.trait[0x57] = uVar29;
  if (((piVar1[0x46] == 0) && (armour_swap_resist_cold == '\0')) &&
     (weapon_swap_resist_cold == '\0')) {
    _Var22 = borg_spell_legal_fail(RESISTANCE,L'\x0f');
    uVar26 = (uint)_Var22;
  }
  piVar1 = borg.trait;
  borg.trait[0x58] = uVar26;
  uVar29 = 1;
  if (((piVar1[0x49] == 0) && (armour_swap_resist_pois == '\0')) &&
     (weapon_swap_resist_pois == '\0')) {
    _Var22 = borg_spell_legal_fail(RESIST_POISON,L'\x0f');
    uVar29 = (uint)_Var22;
  }
  piVar1 = borg.trait;
  borg.trait[0x5b] = uVar29;
  piVar1[0x5c] = (uint)(weapon_swap_resist_fear != '\0' ||
                       (armour_swap_resist_fear != '\0' || piVar1[0x4a] != 0));
  piVar1[0x5d] = (uint)(weapon_swap_resist_light != '\0' ||
                       (armour_swap_resist_light != '\0' || piVar1[0x4b] != 0));
  piVar1[0x5e] = (uint)(weapon_swap_resist_dark != '\0' ||
                       (armour_swap_resist_dark != '\0' || piVar1[0x4c] != 0));
  piVar1[0x5f] = (uint)(weapon_swap_resist_blind != '\0' ||
                       (armour_swap_resist_blind != '\0' || piVar1[0x4d] != 0));
  piVar1[0x60] = (uint)(weapon_swap_resist_conf != '\0' ||
                       (armour_swap_resist_conf != '\0' || piVar1[0x4e] != 0));
  piVar1[0x61] = (uint)(weapon_swap_resist_sound != '\0' ||
                       (armour_swap_resist_sound != '\0' || piVar1[0x4f] != 0));
  piVar1[0x62] = (uint)(weapon_swap_resist_shard != '\0' ||
                       (armour_swap_resist_shard != '\0' || piVar1[0x50] != 0));
  piVar1[99] = (uint)(weapon_swap_resist_nexus != '\0' ||
                     (armour_swap_resist_nexus != '\0' || piVar1[0x51] != 0));
  piVar1[100] = (uint)(weapon_swap_resist_neth != '\0' ||
                      (armour_swap_resist_neth != '\0' || piVar1[0x52] != 0));
  piVar1[0x65] = (uint)(weapon_swap_resist_chaos != '\0' ||
                       (armour_swap_resist_chaos != '\0' || piVar1[0x53] != 0));
  piVar1[0x66] = (uint)(weapon_swap_resist_disen != '\0' ||
                       (armour_swap_resist_disen != '\0' || piVar1[0x54] != 0));
  piVar1[0x67] = (uint)(weapon_swap_hold_life != '\0' ||
                       (armour_swap_hold_life != '\0' || piVar1[0x55] != 0));
  piVar1[0x68] = (uint)(weapon_swap_free_act != '\0' ||
                       (armour_swap_free_act != '\0' || piVar1[0x56] != 0));
  iVar32 = borg_adj_str_wgt[piVar1[0xf]];
  piVar1[0x105] = iVar32 * 100;
  iVar30 = piVar1[0x104] + iVar32 * -0x32;
  if (iVar30 != 0 && SBORROW4(piVar1[0x104],iVar32 * 0x32) == iVar30 < 0) {
    piVar1[0x2c] = piVar1[0x2c] - iVar30 / (iVar32 * 10);
  }
  if (199 < piVar1[0x2c]) {
    piVar1[0x2c] = 199;
  }
  borg_game_ratio = 1000;
  if (0x6e < piVar1[0x2c]) {
    borg_game_ratio = (int16_t)(100000 / (ulong)(piVar1[0x2c] * 10 - 1000));
  }
  piVar1[0x108] = 0;
  if ((0x62 < piVar1[0x6a]) &&
     ((borg_notice_home((borg_item_conflict *)0x0,false),
      (int)num_life_true + (int)num_ezheal_true + (int)num_heal_true +
      borg.trait[0xd7] + borg.has[kv_potion_healing] + borg.trait[0xd8] < 0x1e ||
      ((int)num_speed + borg.trait[0xda] < 0xf)))) {
    borg.trait[0x108] = 1;
  }
  return;
}

Assistant:

void borg_notice(bool notice_swap)
{
    /* Clear out trait arrays */
    memset(borg.has, 0, z_info->k_max * sizeof(int));
    memset(borg.trait, 0, BI_MAX * sizeof(int));
    memset(borg.activation, 0, z_info->act_max * sizeof(int));

    /* Start with a single blow per turn */
    borg.trait[BI_BLOWS] = 1;

    /* speed starts at 110 */
    borg.trait[BI_SPEED] = 110;

    /* Reset the "ammo" attributes */
    borg.trait[BI_AMMO_TVAL] = -1;
    borg.trait[BI_AMMO_SIDES] = 4;

    /* Many of our variables are tied to borg.trait[], which is erased at the
     * the start of borg_notice().  So we must update the frame the cheat in
     * all the non inventory skills.
     */
    borg_notice_player();

    /*** Process books/spells ***/
    if (borg_do_spell) {
        borg_cheat_spells();
        borg_do_spell = false;
    }

    /* Notice the equipment */
    borg_notice_equipment();

    /* Notice the inventory */
    borg_notice_inventory();

    /* Notice and locate my swap weapon */
    if (notice_swap) {
        borg_notice_weapon_swap();
        borg_notice_armour_swap();
    }
    borg.trait[BI_SRACID]
        = borg.trait[BI_RACID] || armour_swap_resist_acid
          || weapon_swap_resist_acid
          || borg_spell_legal_fail(RESISTANCE, 15); /* Res FECAP */
    borg.trait[BI_SRELEC]
        = borg.trait[BI_RELEC] || armour_swap_resist_elec
          || weapon_swap_resist_elec
          || borg_spell_legal_fail(RESISTANCE, 15); /* Res FECAP */
    borg.trait[BI_SRFIRE]
        = borg.trait[BI_RFIRE] || armour_swap_resist_fire
          || weapon_swap_resist_fire
          || borg_spell_legal_fail(RESISTANCE, 15); /* Res FECAP */
    borg.trait[BI_SRCOLD]
        = borg.trait[BI_RCOLD] || armour_swap_resist_cold
          || weapon_swap_resist_cold
          || borg_spell_legal_fail(RESISTANCE, 15); /* Res FECAP */
    borg.trait[BI_SRPOIS]
        = borg.trait[BI_RPOIS] || armour_swap_resist_pois
          || weapon_swap_resist_pois
          || borg_spell_legal_fail(RESIST_POISON, 15); /* Res P */
    borg.trait[BI_SRFEAR] = borg.trait[BI_RFEAR] || armour_swap_resist_fear
                            || weapon_swap_resist_fear;
    borg.trait[BI_SRLITE] = borg.trait[BI_RLITE] || armour_swap_resist_light
                            || weapon_swap_resist_light;
    borg.trait[BI_SRDARK] = borg.trait[BI_RDARK] || armour_swap_resist_dark
                            || weapon_swap_resist_dark;
    borg.trait[BI_SRBLIND] = borg.trait[BI_RBLIND] || armour_swap_resist_blind
                             || weapon_swap_resist_blind;
    borg.trait[BI_SRCONF] = borg.trait[BI_RCONF] || armour_swap_resist_conf
                            || weapon_swap_resist_conf;
    borg.trait[BI_SRSND] = borg.trait[BI_RSND] || armour_swap_resist_sound
                           || weapon_swap_resist_sound;
    borg.trait[BI_SRSHRD] = borg.trait[BI_RSHRD] || armour_swap_resist_shard
                            || weapon_swap_resist_shard;
    borg.trait[BI_SRNXUS] = borg.trait[BI_RNXUS] || armour_swap_resist_nexus
                            || weapon_swap_resist_nexus;
    borg.trait[BI_SRNTHR] = borg.trait[BI_RNTHR] || armour_swap_resist_neth
                            || weapon_swap_resist_neth;
    borg.trait[BI_SRKAOS] = borg.trait[BI_RKAOS] || armour_swap_resist_chaos
                            || weapon_swap_resist_chaos;
    borg.trait[BI_SRDIS] = borg.trait[BI_RDIS] || armour_swap_resist_disen
                           || weapon_swap_resist_disen;
    borg.trait[BI_SHLIFE] = borg.trait[BI_HLIFE] || armour_swap_hold_life
                            || weapon_swap_hold_life;
    borg.trait[BI_SFRACT]
        = borg.trait[BI_FRACT] || armour_swap_free_act || weapon_swap_free_act;

    /* Apply "encumbrance" from weight */
    /* Extract the "weight limit" (in tenth pounds) */
    borg.trait[BI_CARRY] = borg_adj_str_wgt[borg.trait[BI_STR_INDEX]] * 100;

    /* Apply "encumbrance" from weight */
    if (borg.trait[BI_WEIGHT] > borg.trait[BI_CARRY] / 2)
        borg.trait[BI_SPEED]
            -= ((borg.trait[BI_WEIGHT] - (borg.trait[BI_CARRY] / 2))
                / (borg.trait[BI_CARRY] / 10));

    /* top speed */
    if (borg.trait[BI_SPEED] > 199)
        borg.trait[BI_SPEED] = 199;

    /* Check my ratio for decrementing variables */
    if (borg.trait[BI_SPEED] > 110) {
        borg_game_ratio = 100000 / (((borg.trait[BI_SPEED] - 110) * 10) + 100);
    } else {
        borg_game_ratio = 1000;
    }

    /* set if we are preparing for fighting morgoth or sauron */
    borg.trait[BI_PREP_BIG_FIGHT] = false;
    if (borg.trait[BI_MAXDEPTH] >= 99) {

        /* Examine the home */
        borg_notice_home(NULL, false);

        /* pot of healing + *healing* + life */
        int total_big_heal = borg.has[kv_potion_healing];
        total_big_heal += borg.trait[BI_AEZHEAL];
        total_big_heal += borg.trait[BI_ALIFE];

        /* plus the same at home */
        total_big_heal += num_heal_true;
        total_big_heal += num_ezheal_true;
        total_big_heal += num_life_true;

        /* want bunches of heal and speed to feel prepped for the fight */
        if (total_big_heal < 30 || (num_speed + borg.trait[BI_ASPEED]) < 15)
            borg.trait[BI_PREP_BIG_FIGHT] = true;
    }
}